

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutil_posix.cpp
# Opt level: O3

bool getFileAttributes(char *path,uint64_t *mtime,uint64_t *size)

{
  int iVar1;
  stat st;
  stat local_a0;
  
  iVar1 = stat(path,&local_a0);
  if (iVar1 == 0) {
    *mtime = local_a0.st_mtim.tv_sec;
    *size = local_a0.st_size;
  }
  return iVar1 == 0;
}

Assistant:

bool getFileAttributes(const char* path, uint64_t* mtime, uint64_t* size)
{
	struct stat st;

	if (stat(path, &st) == 0)
	{
		*mtime = st.st_mtime;
		*size = st.st_size;
		return true;
	}

	return false;
}